

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_crashes.cpp
# Opt level: O0

void __thiscall
CrashTest_PureVirtualMethodCallTest_Test::TestBody(CrashTest_PureVirtualMethodCallTest_Test *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *message;
  AssertHelper local_120;
  Message local_118;
  int local_10c;
  exception *gtest_exception;
  ReturnSentinel local_d0;
  ReturnSentinel gtest_sentinel;
  scoped_ptr<testing::internal::DeathTest> gtest_dt_ptr;
  DeathTest *local_b0;
  DeathTest *gtest_dt;
  RE *local_18;
  RE *gtest_regex;
  CrashTest_PureVirtualMethodCallTest_Test *this_local;
  
  gtest_regex = (RE *)this;
  bVar1 = testing::internal::AlwaysTrue();
  if (!bVar1) goto LAB_0010d61e;
  testing::internal::RE::RE((RE *)&gtest_dt,"");
  local_18 = (RE *)&gtest_dt;
  bVar1 = testing::internal::DeathTest::Create
                    ("Derived()",(RE *)&gtest_dt,
                     "/workspace/llm4binary/github/license_c_cmakelists/ribtoks[P]chillout/src/tests/tests_crashes.cpp"
                     ,6,&local_b0);
  if (bVar1) {
    if (local_b0 != (DeathTest *)0x0) {
      testing::internal::scoped_ptr<testing::internal::DeathTest>::scoped_ptr
                ((scoped_ptr<testing::internal::DeathTest> *)&gtest_sentinel,local_b0);
      iVar2 = (*local_b0->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_b0->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_b0->_vptr_DeathTest[4])(local_b0,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_0010d5b0;
        local_10c = 2;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_d0,local_b0);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            Derived::Derived((Derived *)&gtest_exception);
            Derived::~Derived((Derived *)&gtest_exception);
          }
          (*local_b0->_vptr_DeathTest[5])(local_b0,2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_d0);
        }
LAB_0010d5b0:
        local_10c = 0;
      }
      testing::internal::scoped_ptr<testing::internal::DeathTest>::~scoped_ptr
                ((scoped_ptr<testing::internal::DeathTest> *)&gtest_sentinel);
      if (local_10c != 0) goto LAB_0010d5ec;
    }
    local_10c = 0;
  }
  else {
    local_10c = 2;
  }
LAB_0010d5ec:
  testing::internal::RE::~RE((RE *)&gtest_dt);
  if (local_10c == 0) {
    return;
  }
LAB_0010d61e:
  testing::Message::Message(&local_118);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_120,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ribtoks[P]chillout/src/tests/tests_crashes.cpp"
             ,6,message);
  testing::internal::AssertHelper::operator=(&local_120,&local_118);
  testing::internal::AssertHelper::~AssertHelper(&local_120);
  testing::Message::~Message(&local_118);
  return;
}

Assistant:

TEST (CrashTest, PureVirtualMethodCallTest) {
    ASSERT_DEATH(Derived(), "");
}